

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# igsc_cli.c
# Opt level: O0

void print_fwdata_version(char *prefix,igsc_fwdata_version2 *fwdata_version)

{
  uint32_t local_50;
  uint32_t local_48;
  uint32_t local_3c;
  igsc_fwdata_version2 *fwdata_version_local;
  char *prefix_local;
  
  if ((fwdata_version->flags & 1) == 0) {
    local_3c = 999999;
  }
  else {
    local_3c = fwdata_version->oem_manuf_data_version_fitb;
  }
  if (fwdata_version->format_version < 2) {
    local_48 = 999999;
  }
  else {
    local_48 = fwdata_version->data_arb_svn;
  }
  if ((fwdata_version->format_version < 2) || ((fwdata_version->flags & 1) == 0)) {
    local_50 = 999999;
  }
  else {
    local_50 = fwdata_version->data_arb_svn_fitb;
  }
  printf("%sFw Data Version: Format %u, Major Version: %u, OEM Manufacturing Data Version: %u, Major VCN: %u\n    OEM Manufacturing Data Version FITB: %u, Flags: 0X%08x, ARB SVN: %u, ARB SVN FITB: %u\n"
         ,prefix,(ulong)fwdata_version->format_version,(ulong)fwdata_version->major_version,
         (ulong)fwdata_version->oem_manuf_data_version,(ulong)fwdata_version->major_vcn,local_3c,
         fwdata_version->flags,local_48,local_50);
  return;
}

Assistant:

static void print_fwdata_version(const char *prefix,
                                 const struct igsc_fwdata_version2 *fwdata_version)
{
    printf("%sFw Data Version: Format %u, Major Version: %u, OEM Manufacturing Data Version: %u, Major VCN: %u\n \
   OEM Manufacturing Data Version FITB: %u, Flags: 0X%08x, ARB SVN: %u, ARB SVN FITB: %u\n",
           prefix,
           fwdata_version->format_version,
           fwdata_version->major_version,
           fwdata_version->oem_manuf_data_version,
           fwdata_version->major_vcn,
           (fwdata_version->flags & IGSC_FWDATA_FITB_VALID_MASK) ?
               fwdata_version->oem_manuf_data_version_fitb : 999999,
           fwdata_version->flags,
           (fwdata_version->format_version > IGSC_FWDATA_FORMAT_VERSION_1) ?
               fwdata_version->data_arb_svn : 999999,
           ((fwdata_version->format_version > IGSC_FWDATA_FORMAT_VERSION_1) &&
	    (fwdata_version->flags & IGSC_FWDATA_FITB_VALID_MASK)) ?
               fwdata_version->data_arb_svn_fitb : 999999);
}